

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_pruneL.h
# Opt level: O2

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::pruneL
          (SparseLUImpl<double,_int> *this,int jcol,IndexVector *perm_r,int pivrow,int nseg,
          IndexVector *segrep,BlockIndexVector *repfnz,IndexVector *xprune,GlobalLU_t *glu)

{
  Matrix<int,__1,_1,_0,__1,_1> *this_00;
  Matrix<int,__1,_1,_0,__1,_1> *this_01;
  Matrix<int,__1,_1,_0,__1,_1> *this_02;
  Scalar SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Scalar SVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Scalar *pSVar10;
  CoeffReturnType piVar11;
  Scalar *pSVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  Scalar *pSVar15;
  ulong uVar16;
  ulong index;
  int iVar17;
  long lVar18;
  ulong index_00;
  int iVar19;
  long index_01;
  
  this_00 = &glu->supno;
  pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,(long)jcol
                      );
  iVar2 = *pSVar10;
  this_01 = &glu->xlsub;
  this_02 = &glu->lsub;
  index = 0;
  uVar16 = (ulong)(uint)nseg;
  if (nseg < 1) {
    uVar16 = index;
  }
  do {
    if (index == uVar16) {
      return;
    }
    piVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)segrep,index);
    iVar3 = *piVar11;
    index_01 = (long)iVar3;
    pSVar12 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                            *)repfnz,index_01);
    if (*pSVar12 != -1) {
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,
                           index_01);
      iVar19 = *pSVar10;
      lVar18 = (long)(iVar3 + 1);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar18
                          );
      if ((iVar19 != *pSVar10) &&
         (pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,
                               index_01), *pSVar10 != iVar2)) {
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xprune,
                             index_01);
        iVar19 = *pSVar10;
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                             lVar18);
        if (*pSVar10 <= iVar19) {
          pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                               index_01);
          iVar19 = *pSVar10;
          pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,
                               lVar18);
          iVar4 = *pSVar10;
          index_00 = (ulong)(iVar4 - 1);
          lVar18 = (long)iVar19;
          while (lVar18 < iVar4) {
            pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_02,
                                 lVar18);
            lVar18 = lVar18 + 1;
            if (*pSVar10 == pivrow) {
              pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                   this_00,index_01);
              pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                                   (long)*pSVar10);
              iVar4 = *pSVar10;
              do {
                index_00 = (ulong)(int)index_00;
                while( true ) {
                  iVar17 = (int)index_00;
                  if (iVar17 < iVar19) {
                    pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                         xprune,index_01);
                    *pSVar10 = iVar19;
                    goto LAB_00173cb5;
                  }
                  pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                       this_02,index_00);
                  piVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                                       perm_r,(long)*pSVar10);
                  if (*piVar11 != -1) break;
                  index_00 = index_00 - 1;
                }
                pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                    ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                     this_02,(long)iVar19);
                piVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                                    ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                                     perm_r,(long)*pSVar10);
                if (*piVar11 == -1) {
                  pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                       this_02,(long)iVar19);
                  pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                       this_02,index_00);
                  SVar5 = *pSVar10;
                  *pSVar10 = *pSVar13;
                  *pSVar13 = SVar5;
                  if (iVar3 == iVar4) {
                    pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                         &glu->xlusup,index_01);
                    iVar6 = *pSVar10;
                    pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                         this_01,index_01);
                    iVar7 = *pSVar10;
                    pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                         &glu->xlusup,index_01);
                    iVar8 = *pSVar10;
                    pSVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                         this_01,index_01);
                    iVar9 = *pSVar10;
                    pSVar14 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                          *)&glu->lusup,(long)((iVar6 + iVar19) - iVar7));
                    pSVar15 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                          *)&glu->lusup,(long)((iVar8 - iVar9) + iVar17));
                    SVar1 = *pSVar14;
                    *pSVar14 = *pSVar15;
                    *pSVar15 = SVar1;
                  }
                  index_00 = (ulong)(iVar17 - 1);
                }
                iVar19 = iVar19 + 1;
              } while( true );
            }
          }
        }
      }
    }
LAB_00173cb5:
    index = index + 1;
  } while( true );
}

Assistant:

void SparseLUImpl<Scalar,Index>::pruneL(const Index jcol, const IndexVector& perm_r, const Index pivrow, const Index nseg, const IndexVector& segrep, BlockIndexVector repfnz, IndexVector& xprune, GlobalLU_t& glu)
{
  // For each supernode-rep irep in U(*,j]
  Index jsupno = glu.supno(jcol); 
  Index i,irep,irep1; 
  bool movnum, do_prune = false; 
  Index kmin = 0, kmax = 0, minloc, maxloc,krow; 
  for (i = 0; i < nseg; i++)
  {
    irep = segrep(i); 
    irep1 = irep + 1; 
    do_prune = false; 
    
    // Don't prune with a zero U-segment 
    if (repfnz(irep) == emptyIdxLU) continue; 
    
    // If a snode overlaps with the next panel, then the U-segment
    // is fragmented into two parts -- irep and irep1. We should let 
    // pruning occur at the rep-column in irep1s snode. 
    if (glu.supno(irep) == glu.supno(irep1) ) continue; // don't prune 
    
    // If it has not been pruned & it has a nonz in row L(pivrow,i)
    if (glu.supno(irep) != jsupno )
    {
      if ( xprune (irep) >= glu.xlsub(irep1) )
      {
        kmin = glu.xlsub(irep);
        kmax = glu.xlsub(irep1) - 1; 
        for (krow = kmin; krow <= kmax; krow++)
        {
          if (glu.lsub(krow) == pivrow) 
          {
            do_prune = true; 
            break; 
          }
        }
      }
      
      if (do_prune) 
      {
        // do a quicksort-type partition
        // movnum=true means that the num values have to be exchanged
        movnum = false; 
        if (irep == glu.xsup(glu.supno(irep)) ) // Snode of size 1 
          movnum = true; 
        
        while (kmin <= kmax)
        {
          if (perm_r(glu.lsub(kmax)) == emptyIdxLU)
            kmax--; 
          else if ( perm_r(glu.lsub(kmin)) != emptyIdxLU)
            kmin++;
          else 
          {
            // kmin below pivrow (not yet pivoted), and kmax
            // above pivrow: interchange the two suscripts
            std::swap(glu.lsub(kmin), glu.lsub(kmax)); 
            
            // If the supernode has only one column, then we 
            // only keep one set of subscripts. For any subscript
            // intercnahge performed, similar interchange must be 
            // done on the numerical values. 
            if (movnum) 
            {
              minloc = glu.xlusup(irep) + ( kmin - glu.xlsub(irep) ); 
              maxloc = glu.xlusup(irep) + ( kmax - glu.xlsub(irep) ); 
              std::swap(glu.lusup(minloc), glu.lusup(maxloc)); 
            }
            kmin++;
            kmax--;
          }
        } // end while 
        
        xprune(irep) = kmin;  //Pruning 
      } // end if do_prune 
    } // end pruning 
  } // End for each U-segment
}